

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O1

void event_track::set_evte(vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in)

{
  pointer *ppuVar1;
  pointer puVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  iterator __position;
  bool bVar3;
  void *pvVar4;
  uint uVar5;
  void *pvVar6;
  pointer puVar7;
  int iVar8;
  pointer puVar9;
  ulong uVar10;
  char *__end;
  void *pvVar11;
  long lVar12;
  allocator_type local_169;
  void *local_168;
  long local_160;
  void *local_158;
  long local_150;
  void *local_148;
  void *local_140;
  long local_138;
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish + -0x10 != puVar7) {
    puVar9 = (pointer)0x0;
    do {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"urim","");
      if ((((puVar7[(long)puVar9] != (uchar)*local_50[0]) ||
           (puVar7[(long)(puVar9 + 1)] != *(uchar *)((long)local_50[0] + 1))) ||
          (puVar7[(long)(puVar9 + 2)] != *(uchar *)((long)local_50[0] + 2))) ||
         (bVar3 = true, puVar7[(long)(puVar9 + 3)] != *(uchar *)((long)local_50[0] + 3))) {
        bVar3 = false;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if (bVar3) {
        puVar2 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(uint *)(puVar9 + (long)(puVar2 + -4));
        puVar7 = puVar9 + (long)(puVar2 + -4);
        puVar7[0] = '\0';
        puVar7[1] = '\0';
        puVar7[2] = '\0';
        puVar7[3] = '\x10';
        puVar9[(long)puVar2] = 'e';
        puVar9[(long)((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + 1)] = 'v';
        puVar9[(long)((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + 2)] = 't';
        puVar9[(long)((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + 3)] = 'e';
        __first._M_current =
             (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,__first,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(__first._M_current + (long)(puVar9 + 0xc)),&local_169);
        pvVar6 = local_140;
        uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        local_150 = local_138;
        local_158 = local_148;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(puVar9 + (long)((moov_in->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                                     ((ulong)uVar5 - 4))),
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish,&local_169);
        iVar8 = uVar5 - 0x10;
        local_168 = local_148;
        local_160 = local_138;
        pvVar11 = local_140;
        goto LAB_00113a1f;
      }
      puVar9 = puVar9 + 1;
      puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (puVar9 < (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish + (-0x10 - (long)puVar7));
  }
  local_160 = 0;
  local_168 = (void *)0x0;
  local_150 = 0;
  pvVar6 = (void *)0x0;
  local_158 = (void *)0x0;
  iVar8 = 0;
  pvVar11 = (void *)0x0;
LAB_00113a1f:
  pvVar4 = local_168;
  if (iVar8 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (moov_in,(long)pvVar6 - (long)local_158);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (moov_in,(size_type)
                       ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_finish +
                       (((long)pvVar11 - (long)pvVar4) -
                       (long)(moov_in->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start) + 1));
    if (pvVar11 != pvVar4) {
      lVar12 = 0;
      do {
        __position._M_current =
             (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)moov_in,__position,
                     (uchar *)(lVar12 + (long)pvVar4));
        }
        else {
          *__position._M_current = *(uchar *)(lVar12 + (long)pvVar4);
          ppuVar1 = &(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        lVar12 = lVar12 + 1;
      } while ((long)pvVar11 - (long)pvVar4 != lVar12);
    }
    puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar7) {
      uVar10 = 0;
      do {
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"stsd","");
        if (((puVar7[uVar10] != (uchar)*local_b0[0]) ||
            (puVar7[uVar10 + 1] != *(uchar *)((long)local_b0[0] + 1))) ||
           ((puVar7[uVar10 + 2] != *(uchar *)((long)local_b0[0] + 2) ||
            (bVar3 = true, puVar7[uVar10 + 3] != *(uchar *)((long)local_b0[0] + 3))))) {
          bVar3 = false;
        }
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        if (bVar3) {
          puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(uint *)(puVar7 + (uVar10 - 4));
          uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
                  - iVar8;
          *(uint *)(puVar7 + (uVar10 - 4)) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
        }
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"stbl","");
        if (((puVar7[uVar10] != (uchar)*local_d0[0]) ||
            (puVar7[uVar10 + 1] != *(uchar *)((long)local_d0[0] + 1))) ||
           ((puVar7[uVar10 + 2] != *(uchar *)((long)local_d0[0] + 2) ||
            (bVar3 = true, puVar7[uVar10 + 3] != *(uchar *)((long)local_d0[0] + 3))))) {
          bVar3 = false;
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        if (bVar3) {
          puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(uint *)(puVar7 + (uVar10 - 4));
          uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
                  - iVar8;
          *(uint *)(puVar7 + (uVar10 - 4)) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
        }
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"uri ","");
        if ((((puVar7[uVar10] != (uchar)*local_f0[0]) ||
             (puVar7[uVar10 + 1] != *(uchar *)((long)local_f0[0] + 1))) ||
            (puVar7[uVar10 + 2] != *(uchar *)((long)local_f0[0] + 2))) ||
           (bVar3 = true, puVar7[uVar10 + 3] != *(uchar *)((long)local_f0[0] + 3))) {
          bVar3 = false;
        }
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        if (bVar3) {
          puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(uint *)(puVar7 + (uVar10 - 4));
          uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
                  - iVar8;
          *(uint *)(puVar7 + (uVar10 - 4)) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
        }
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_110[0] = local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"minf","");
        if (((puVar7[uVar10] != (uchar)*local_110[0]) ||
            (puVar7[uVar10 + 1] != *(uchar *)((long)local_110[0] + 1))) ||
           ((puVar7[uVar10 + 2] != *(uchar *)((long)local_110[0] + 2) ||
            (bVar3 = true, puVar7[uVar10 + 3] != *(uchar *)((long)local_110[0] + 3))))) {
          bVar3 = false;
        }
        if (local_110[0] != local_100) {
          operator_delete(local_110[0],local_100[0] + 1);
        }
        if (bVar3) {
          puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(uint *)(puVar7 + (uVar10 - 4));
          uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
                  - iVar8;
          *(uint *)(puVar7 + (uVar10 - 4)) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
        }
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"mdia","");
        if (((puVar7[uVar10] != (uchar)*local_130[0]) ||
            (puVar7[uVar10 + 1] != *(uchar *)((long)local_130[0] + 1))) ||
           ((puVar7[uVar10 + 2] != *(uchar *)((long)local_130[0] + 2) ||
            (bVar3 = true, puVar7[uVar10 + 3] != *(uchar *)((long)local_130[0] + 3))))) {
          bVar3 = false;
        }
        if (local_130[0] != local_120) {
          operator_delete(local_130[0],local_120[0] + 1);
        }
        if (bVar3) {
          puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(uint *)(puVar7 + (uVar10 - 4));
          uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
                  - iVar8;
          *(uint *)(puVar7 + (uVar10 - 4)) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
        }
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"trak","");
        if ((((puVar7[uVar10] != (uchar)*local_70[0]) ||
             (puVar7[uVar10 + 1] != *(uchar *)((long)local_70[0] + 1))) ||
            (puVar7[uVar10 + 2] != *(uchar *)((long)local_70[0] + 2))) ||
           (bVar3 = true, puVar7[uVar10 + 3] != *(uchar *)((long)local_70[0] + 3))) {
          bVar3 = false;
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (bVar3) {
          puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(uint *)(puVar7 + (uVar10 - 4));
          uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
                  - iVar8;
          *(uint *)(puVar7 + (uVar10 - 4)) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
        }
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"moov","");
        if (((puVar7[uVar10] != (uchar)*local_90[0]) ||
            (puVar7[uVar10 + 1] != *(uchar *)((long)local_90[0] + 1))) ||
           ((puVar7[uVar10 + 2] != *(uchar *)((long)local_90[0] + 2) ||
            (bVar3 = true, puVar7[uVar10 + 3] != *(uchar *)((long)local_90[0] + 3))))) {
          bVar3 = false;
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        if (bVar3) {
          puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(uint *)(puVar7 + (uVar10 - 4));
          uVar5 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18)
                  - iVar8;
          *(uint *)(puVar7 + (uVar10 - 4)) =
               uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 * 0x1000000;
        }
        uVar10 = uVar10 + 1;
        puVar7 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar10 < (ulong)((long)(moov_in->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar7));
    }
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168,local_160 - (long)local_168);
  }
  if (local_158 != (void *)0x0) {
    operator_delete(local_158,local_150 - (long)local_158);
  }
  return;
}

Assistant:

void event_track::set_evte(std::vector<uint8_t>& moov_in)
{
	uint32_t size_diff = 0;

	std::vector<uint8_t> l_first;
	std::vector<uint8_t> l_last;

	// find the uri box containing the description of the urn, caerfull only use for the enclosed mdat box in the source code
	for (std::size_t k = 0; k < moov_in.size() - 16; k++)
	{
		if (compare_4cc((char *)&moov_in[k], std::string("urim")))
		{
			//cout << "urim box found" << endl;
			uint32_t or_size = fmp4_read_uint32((char *)&moov_in[k - 4]);
			fmp4_write_uint32(16, (char *)&moov_in[k - 4]);

			moov_in[k]     = 'e';
			moov_in[k + 1] = 'v';
			moov_in[k + 2] = 't';
			moov_in[k + 3] = 'e';

			size_diff = (uint32_t)(or_size - 16);

			// first part of the string
			l_first = std::vector<uint8_t>(moov_in.begin(), moov_in.begin() + k + 12);
			// last part of the string
			l_last = std::vector<uint8_t>(moov_in.begin() + k + or_size - 4, moov_in.end());

			size_t l_diff = moov_in.size() - l_first.size() - l_last.size() - size_diff;

			break;
		}
	}

	// new string representing the moov_box 
	if (size_diff != 0)
	{
		// cout << "scheme size difference is: " << size_diff << endl;

		moov_in.resize(l_first.size());
		moov_in.reserve(moov_in.size() + l_last.size() + 1);

		for (std::size_t i = 0; i < l_last.size(); i++)
			moov_in.push_back(l_last[i]);

		for (std::size_t i = 0; i < moov_in.size(); i++)
		{

			if (compare_4cc((char *)&moov_in[i], std::string("stsd")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("stbl")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("uri ")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}

			if (compare_4cc((char *)&moov_in[i], std::string("minf")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("mdia")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("trak")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("moov")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
		}
	}
}